

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O1

int Pm_QueueFull(PmQueue *q)

{
  long lVar1;
  
  if (q == (PmQueue *)0x0) {
    return -0x270b;
  }
  if (0 < (long)*(int *)((long)q + 0x20)) {
    lVar1 = 0;
    do {
      if (*(int *)(*(long *)((long)q + 8) * 4 + *(long *)((long)q + 0x28) + lVar1 * 4) != 0) {
        return 1;
      }
      lVar1 = lVar1 + 1;
    } while (*(int *)((long)q + 0x20) != lVar1);
  }
  return 0;
}

Assistant:

PMEXPORT int Pm_QueueFull(PmQueue *q)
{
    long tail;
    int i; 
    PmQueueRep *queue = (PmQueueRep *) q;
    /* arg checking */
    if (!queue)
        return pmBadPtr;
    tail = queue->tail;
    /* test to see if there is space in the queue */
    for (i = 0; i < queue->msg_size; i++) {
        if (queue->buffer[tail + i]) {
            return TRUE;
        }
    }
    return FALSE;
}